

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynBase * ParseArithmetic(ParseContext *ctx)

{
  bool bVar1;
  SynBase *pSVar2;
  LexemeType type;
  uint uVar3;
  uint uVar4;
  SynBinaryOpElement *pSVar5;
  Lexeme *pLVar6;
  ParseContext *pPVar7;
  SynBinaryOpElement *lastOp_1;
  SynBinaryOpElement *local_38;
  SynBinaryOpElement *lastOp;
  Lexeme *start;
  SynBinaryOpType binaryOp;
  uint startSize;
  SynBase *lhs;
  ParseContext *ctx_local;
  
  lhs = (SynBase *)ctx;
  _binaryOp = (ParseContext *)ParseTerminal(ctx);
  if (_binaryOp == (ParseContext *)0x0) {
    ctx_local = (ParseContext *)0x0;
  }
  else {
    start._4_4_ = SmallArray<SynBinaryOpElement,_32U>::size
                            ((SmallArray<SynBinaryOpElement,_32U> *)&lhs[0x11].begin);
    while( true ) {
      type = ParseContext::Peek((ParseContext *)lhs);
      start._0_4_ = GetBinaryOpType(type);
      if ((SynBinaryOpType)start == SYN_BINARY_OP_UNKNOWN) break;
      lastOp = (SynBinaryOpElement *)lhs[0x11]._vptr_SynBase;
      ParseContext::Skip((ParseContext *)lhs);
      while( true ) {
        uVar3 = SmallArray<SynBinaryOpElement,_32U>::size
                          ((SmallArray<SynBinaryOpElement,_32U> *)&lhs[0x11].begin);
        bVar1 = false;
        if (start._4_4_ < uVar3) {
          pSVar5 = SmallArray<SynBinaryOpElement,_32U>::back
                             ((SmallArray<SynBinaryOpElement,_32U> *)&lhs[0x11].begin);
          uVar3 = GetBinaryOpPrecedence(pSVar5->type);
          uVar4 = GetBinaryOpPrecedence((SynBinaryOpType)start);
          bVar1 = uVar3 <= uVar4;
        }
        pSVar5 = lastOp;
        if (!bVar1) break;
        local_38 = SmallArray<SynBinaryOpElement,_32U>::back
                             ((SmallArray<SynBinaryOpElement,_32U> *)&lhs[0x11].begin);
        pPVar7 = (ParseContext *)ParseContext::get<SynBinaryOp>((ParseContext *)lhs);
        SynBinaryOp::SynBinaryOp
                  ((SynBinaryOp *)pPVar7,local_38->begin,local_38->end,local_38->type,
                   local_38->value,(SynBase *)_binaryOp);
        _binaryOp = pPVar7;
        SmallArray<SynBinaryOpElement,_32U>::pop_back
                  ((SmallArray<SynBinaryOpElement,_32U> *)&lhs[0x11].begin);
      }
      pSVar2 = lhs + 0x11;
      pLVar6 = ParseContext::Previous((ParseContext *)lhs);
      SynBinaryOpElement::SynBinaryOpElement
                ((SynBinaryOpElement *)&lastOp_1,(Lexeme *)pSVar5,pLVar6,(SynBinaryOpType)start,
                 (SynBase *)_binaryOp);
      SmallArray<SynBinaryOpElement,_32U>::push_back
                ((SmallArray<SynBinaryOpElement,_32U> *)&pSVar2->begin,
                 (SynBinaryOpElement *)&lastOp_1);
      _binaryOp = (ParseContext *)ParseTerminal((ParseContext *)lhs);
      pSVar2 = lhs;
      if (_binaryOp == (ParseContext *)0x0) {
        pLVar6 = ParseContext::Current((ParseContext *)lhs);
        anon_unknown.dwarf_104b6::Report
                  ((ParseContext *)pSVar2,pLVar6,
                   "ERROR: expression not found after binary operation");
        pPVar7 = (ParseContext *)ParseContext::get<SynError>((ParseContext *)lhs);
        pSVar5 = lastOp;
        pLVar6 = ParseContext::Previous((ParseContext *)lhs);
        SynError::SynError((SynError *)pPVar7,(Lexeme *)pSVar5,pLVar6);
        _binaryOp = pPVar7;
      }
    }
    start._0_4_ = 0;
    while (uVar3 = SmallArray<SynBinaryOpElement,_32U>::size
                             ((SmallArray<SynBinaryOpElement,_32U> *)&lhs[0x11].begin),
          start._4_4_ < uVar3) {
      pSVar5 = SmallArray<SynBinaryOpElement,_32U>::back
                         ((SmallArray<SynBinaryOpElement,_32U> *)&lhs[0x11].begin);
      pPVar7 = (ParseContext *)ParseContext::get<SynBinaryOp>((ParseContext *)lhs);
      SynBinaryOp::SynBinaryOp
                ((SynBinaryOp *)pPVar7,pSVar5->begin,pSVar5->end,pSVar5->type,pSVar5->value,
                 (SynBase *)_binaryOp);
      _binaryOp = pPVar7;
      SmallArray<SynBinaryOpElement,_32U>::pop_back
                ((SmallArray<SynBinaryOpElement,_32U> *)&lhs[0x11].begin);
    }
    ctx_local = _binaryOp;
  }
  return (SynBase *)ctx_local;
}

Assistant:

SynBase* ParseArithmetic(ParseContext &ctx)
{
	SynBase *lhs = ParseTerminal(ctx);

	if(!lhs)
		return NULL;

	unsigned startSize = ctx.binaryOpStack.size();

	while(SynBinaryOpType binaryOp = GetBinaryOpType(ctx.Peek()))
	{
		Lexeme *start = ctx.currentLexeme;

		ctx.Skip();

		while(ctx.binaryOpStack.size() > startSize && GetBinaryOpPrecedence(ctx.binaryOpStack.back().type) <= GetBinaryOpPrecedence(binaryOp))
		{
			SynBinaryOpElement &lastOp = ctx.binaryOpStack.back();

			lhs = new (ctx.get<SynBinaryOp>()) SynBinaryOp(lastOp.begin, lastOp.end, lastOp.type, lastOp.value, lhs);

			ctx.binaryOpStack.pop_back();
		}

		ctx.binaryOpStack.push_back(SynBinaryOpElement(start, ctx.Previous(), binaryOp, lhs));

		lhs = ParseTerminal(ctx);

		if(!lhs)
		{
			Report(ctx, ctx.Current(), "ERROR: expression not found after binary operation");

			lhs = new (ctx.get<SynError>()) SynError(start, ctx.Previous());
		}
	}

	while(ctx.binaryOpStack.size() > startSize)
	{
		SynBinaryOpElement &lastOp = ctx.binaryOpStack.back();

		lhs = new (ctx.get<SynBinaryOp>()) SynBinaryOp(lastOp.begin, lastOp.end, lastOp.type, lastOp.value, lhs);

		ctx.binaryOpStack.pop_back();
	}

	return lhs;
}